

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

int imagetotif(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  convert_32s_PXCX p_Var3;
  opj_image_comp_t *poVar4;
  long lVar5;
  size_t __size;
  OPJ_BYTE *pOVar6;
  OPJ_INT32 *pOVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  OPJ_INT32 OVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  size_t sStack_90;
  convert_32sXXx_C1R local_88;
  OPJ_INT32 *planes [4];
  
  poVar2 = image->comps;
  uVar10 = poVar2->prec;
  planes[0] = poVar2->data;
  uVar9 = image->numcomps;
  uVar8 = 4;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if (3 < uVar9) {
      sStack_90 = 5;
      goto LAB_0010db75;
    }
    pcVar13 = "imagetotif: CMYK images shall be composed of at least 4 planes.\n";
    sStack_90 = 0x40;
  }
  else {
    if (uVar9 < 3) {
      sStack_90 = 1;
      uVar8 = uVar9;
    }
    else {
      if (uVar9 < 4) {
        uVar8 = uVar9;
      }
      sStack_90 = 2;
    }
LAB_0010db75:
    uVar14 = (ulong)uVar8;
    uVar9 = uVar8 + (uVar8 == 0);
    poVar4 = poVar2;
    for (uVar11 = 1; uVar11 < uVar14; uVar11 = uVar11 + 1) {
      if ((((poVar2->dx != poVar4[1].dx) || (poVar2->dy != poVar4[1].dy)) ||
          (uVar10 != poVar4[1].prec)) || (poVar2->sgnd != poVar4[1].sgnd)) {
        uVar9 = (uint)uVar11;
        break;
      }
      pOVar7 = poVar4[1].data;
      planes[uVar11] = pOVar7;
      if (pOVar7 == (OPJ_INT32 *)0x0) {
        pcVar13 = "imagetotif: planes[%d] == NULL.\n";
        goto LAB_0010de9b;
      }
      poVar4 = poVar4 + 1;
    }
    if (uVar9 == uVar8) {
      uVar9 = 0;
      if ((uVar10 & 0xffff) < 0x11) {
        uVar9 = uVar10;
      }
      if ((short)uVar9 == 0) {
        pcVar13 = "imagetotif: Bits=%d, Only 1 to 16 bits implemented\n";
        uVar11 = 0;
LAB_0010de9b:
        fprintf(_stderr,pcVar13,uVar11);
        goto LAB_0010dfc2;
      }
      lVar5 = TIFFOpen(outfile,"wb");
      if (lVar5 == 0) {
        fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
        return 1;
      }
      uVar9 = uVar9 & 0xffff;
      for (lVar15 = 0; uVar14 << 6 != lVar15; lVar15 = lVar15 + 0x40) {
        clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar15),image->comps->prec);
      }
      OVar12 = 0;
      switch(uVar9) {
      case 1:
      case 2:
      case 4:
      case 6:
      case 8:
        local_88 = convert_32sXXu_C1R_LUT[uVar9];
        break;
      case 3:
        local_88 = tif_32sto3u;
        break;
      case 5:
        local_88 = tif_32sto5u;
        break;
      case 7:
        local_88 = tif_32sto7u;
        break;
      case 9:
        local_88 = tif_32sto9u;
        break;
      case 10:
        local_88 = tif_32sto10u;
        break;
      case 0xb:
        local_88 = tif_32sto11u;
        break;
      case 0xc:
        local_88 = tif_32sto12u;
        break;
      case 0xd:
        local_88 = tif_32sto13u;
        break;
      case 0xe:
        local_88 = tif_32sto14u;
        break;
      case 0xf:
        local_88 = tif_32sto15u;
        break;
      case 0x10:
        local_88 = tif_32sto16u;
        break;
      default:
        local_88 = (convert_32sXXx_C1R)0x0;
      }
      poVar2 = image->comps;
      if (poVar2->sgnd != 0) {
        OVar12 = 1 << ((char)poVar2->prec - 1U & 0x1f);
      }
      p_Var3 = convert_32s_PXCX_LUT[uVar14];
      uVar10 = poVar2->w;
      uVar11 = (ulong)uVar10;
      OVar1 = poVar2->h;
      TIFFSetField(lVar5,0x100,uVar11);
      TIFFSetField(lVar5,0x101,OVar1);
      TIFFSetField(lVar5,0x115,uVar14);
      TIFFSetField(lVar5,0x102,uVar9);
      TIFFSetField(lVar5,0x112,1);
      TIFFSetField(lVar5,0x11c,1);
      TIFFSetField(lVar5,0x106,sStack_90);
      TIFFSetField(lVar5,0x116,1);
      __size = TIFFStripSize(lVar5);
      if ((int)(uVar14 * uVar11 >> 0x20) == 0) {
        uVar10 = uVar10 * uVar8;
        if ((0x3fffffff < uVar10) || ((int)((ulong)uVar9 * (ulong)uVar10 >> 0x20) != 0))
        goto LAB_0010de58;
        if (__size == uVar10 * uVar9 + 7 >> 3) {
          pOVar6 = (OPJ_BYTE *)malloc(__size);
          if (pOVar6 != (OPJ_BYTE *)0x0) {
            pOVar7 = (OPJ_INT32 *)malloc(uVar14 * uVar11 * 4);
            if (pOVar7 != (OPJ_INT32 *)0x0) {
              for (uVar10 = 0; uVar10 < image->comps->h; uVar10 = uVar10 + 1) {
                (*p_Var3)(planes,pOVar7,uVar11,OVar12);
                (*local_88)(pOVar7,pOVar6,uVar14 * uVar11);
                TIFFWriteEncodedStrip(lVar5,uVar10,pOVar6,__size);
                planes[0] = planes[0] + uVar11;
                planes[1] = planes[1] + uVar11;
                planes[2] = planes[2] + uVar11;
                planes[3] = planes[3] + uVar11;
              }
              _TIFFfree(pOVar6);
              TIFFClose(lVar5);
              free(pOVar7);
              return 0;
            }
            _TIFFfree(pOVar6);
          }
          goto LAB_0010df87;
        }
        pcVar13 = "Invalid TIFF strip size\n";
        sStack_90 = 0x18;
      }
      else {
LAB_0010de58:
        pcVar13 = "Buffer overflow\n";
        sStack_90 = 0x10;
      }
      fwrite(pcVar13,sStack_90,1,_stderr);
LAB_0010df87:
      TIFFClose(lVar5);
      return 1;
    }
    pcVar13 = "imagetotif: All components shall have the same subsampling, same bit depth.\n";
    sStack_90 = 0x4c;
  }
  fwrite(pcVar13,sStack_90,1,_stderr);
LAB_0010dfc2:
  fwrite("\tAborting\n",10,1,_stderr);
  return 1;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
    TIFF *tif;
    tdata_t buf;
    uint32_t width, height;
    uint16_t bps, tiPhoto;
    int adjust, sgnd;
    int64_t strip_size, rowStride, TIFF_MAX;
    OPJ_UINT32 i, numcomps;
    OPJ_INT32* buffer32s = NULL;
    OPJ_INT32 const* planes[4];
    convert_32s_PXCX cvtPxToCx = NULL;
    convert_32sXXx_C1R cvt32sToTif = NULL;

    bps = (uint16_t)image->comps[0].prec;
    planes[0] = image->comps[0].data;

    numcomps = image->numcomps;

    if (image->color_space == OPJ_CLRSPC_CMYK) {
        if (numcomps < 4U) {
            fprintf(stderr,
                    "imagetotif: CMYK images shall be composed of at least 4 planes.\n");
            fprintf(stderr, "\tAborting\n");
            return 1;
        }
        tiPhoto = PHOTOMETRIC_SEPARATED;
        if (numcomps > 4U) {
            numcomps = 4U; /* Alpha not supported */
        }
    } else if (numcomps > 2U) {
        tiPhoto = PHOTOMETRIC_RGB;
        if (numcomps > 4U) {
            numcomps = 4U;
        }
    } else {
        tiPhoto = PHOTOMETRIC_MINISBLACK;
    }
    for (i = 1U; i < numcomps; ++i) {
        if (image->comps[0].dx != image->comps[i].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[i].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[i].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[i].sgnd) {
            break;
        }
        planes[i] = image->comps[i].data;
        if (planes[i] == NULL) {
            fprintf(stderr,
                    "imagetotif: planes[%d] == NULL.\n", i);
            fprintf(stderr, "\tAborting\n");
            return 1;
        }
    }
    if (i != numcomps) {
        fprintf(stderr,
                "imagetotif: All components shall have the same subsampling, same bit depth.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }

    if (bps > 16) {
        bps = 0;
    }
    if (bps == 0) {
        fprintf(stderr, "imagetotif: Bits=%d, Only 1 to 16 bits implemented\n", bps);
        fprintf(stderr, "\tAborting\n");
        return 1;
    }
    tif = TIFFOpen(outfile, "wb");
    if (!tif) {
        fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
        return 1;
    }
    for (i = 0U; i < numcomps; ++i) {
        clip_component(&(image->comps[i]), image->comps[0].prec);
    }
    cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
    switch (bps) {
    case 1:
    case 2:
    case 4:
    case 6:
    case 8:
        cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
        break;
    case 3:
        cvt32sToTif = tif_32sto3u;
        break;
    case 5:
        cvt32sToTif = tif_32sto5u;
        break;
    case 7:
        cvt32sToTif = tif_32sto7u;
        break;
    case 9:
        cvt32sToTif = tif_32sto9u;
        break;
    case 10:
        cvt32sToTif = tif_32sto10u;
        break;
    case 11:
        cvt32sToTif = tif_32sto11u;
        break;
    case 12:
        cvt32sToTif = tif_32sto12u;
        break;
    case 13:
        cvt32sToTif = tif_32sto13u;
        break;
    case 14:
        cvt32sToTif = tif_32sto14u;
        break;
    case 15:
        cvt32sToTif = tif_32sto15u;
        break;
    case 16:
        cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
        break;
    default:
        /* never here */
        break;
    }
    sgnd = (int)image->comps[0].sgnd;
    adjust = sgnd ? (int)(1 << (image->comps[0].prec - 1)) : 0;
    width   = (uint32_t)image->comps[0].w;
    height  = (uint32_t)image->comps[0].h;

    TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
    TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, (uint16_t)numcomps);
    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
    TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
    TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
    TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
    if (sizeof(tsize_t) == 4) {
        TIFF_MAX = INT_MAX;
    } else {
        TIFF_MAX = UINT_MAX;
    }
    strip_size = (int64_t)TIFFStripSize(tif);

    if ((int64_t)width > (int64_t)(TIFF_MAX / numcomps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / bps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / (int64_t)sizeof(
                        OPJ_INT32))) {
        fprintf(stderr, "Buffer overflow\n");
        TIFFClose(tif);
        return 1;
    }
    rowStride = (int64_t)((width * numcomps * bps + 7U) / 8U);
    if (rowStride != strip_size) {
        fprintf(stderr, "Invalid TIFF strip size\n");
        TIFFClose(tif);
        return 1;
    }
    buf = malloc((OPJ_SIZE_T)strip_size);
    if (buf == NULL) {
        TIFFClose(tif);
        return 1;
    }
    buffer32s = (OPJ_INT32 *)malloc(sizeof(OPJ_INT32) * width * numcomps);
    if (buffer32s == NULL) {
        _TIFFfree(buf);
        TIFFClose(tif);
        return 1;
    }

    for (i = 0; i < image->comps[0].h; ++i) {
        cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
        cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
        (void)TIFFWriteEncodedStrip(tif, i, (void*)buf, (tsize_t)strip_size);
        planes[0] += width;
        planes[1] += width;
        planes[2] += width;
        planes[3] += width;
    }
    _TIFFfree((void*)buf);
    TIFFClose(tif);
    free(buffer32s);

    return 0;
}